

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O3

void anon_unknown.dwarf_229b2::verifyPixelsAreEqual<half>
               (DeepImageChannel *c1,DeepImageChannel *c2,int dx,int dy)

{
  int y;
  uint uVar1;
  ImageLevel *pIVar2;
  _func_int **pp_Var3;
  bool bVar4;
  ImageChannel *this;
  ImageChannel *this_00;
  DeepImageLevel *pDVar5;
  DeepImageLevel *pDVar6;
  ArgExc *this_01;
  ulong uVar7;
  int iVar8;
  char *text;
  int iVar9;
  int x;
  
  this = (ImageChannel *)
         __dynamic_cast(c1,&Imf_2_5::DeepImageChannel::typeinfo,
                        &Imf_2_5::TypedDeepImageChannel<half>::typeinfo,0);
  if (this != (ImageChannel *)0x0) {
    this_00 = (ImageChannel *)
              __dynamic_cast(c2,&Imf_2_5::DeepImageChannel::typeinfo,
                             &Imf_2_5::TypedDeepImageChannel<half>::typeinfo,0);
    if (this_00 != (ImageChannel *)0x0) {
      pIVar2 = (c1->super_ImageChannel)._level;
      pDVar5 = Imf_2_5::DeepImageChannel::deepLevel(c1);
      pDVar6 = Imf_2_5::DeepImageChannel::deepLevel(c2);
      y = (pIVar2->_dataWindow).min.y;
      iVar9 = (pIVar2->_dataWindow).max.y;
      if (y <= iVar9) {
        iVar8 = (pIVar2->_dataWindow).max.x;
        do {
          x = (pIVar2->_dataWindow).min.x;
          if (x <= iVar8) {
            iVar9 = y + dy;
            do {
              Imf_2_5::ImageChannel::boundsCheck(&(pDVar5->_sampleCounts).super_ImageChannel,x,y);
              uVar1 = (pDVar5->_sampleCounts)._base
                      [(pDVar5->_sampleCounts).super_ImageChannel._pixelsPerRow * y + x];
              iVar8 = x + dx;
              Imf_2_5::ImageChannel::boundsCheck
                        (&(pDVar6->_sampleCounts).super_ImageChannel,iVar8,iVar9);
              if (uVar1 != (pDVar6->_sampleCounts)._base
                           [(pDVar6->_sampleCounts).super_ImageChannel._pixelsPerRow * iVar9 + iVar8
                           ]) {
                this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                text = "different pixel sample counts";
LAB_0011c874:
                Iex_2_5::ArgExc::ArgExc(this_01,text);
                __cxa_throw(this_01,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
              }
              Imf_2_5::ImageChannel::boundsCheck(this,x,y);
              pp_Var3 = (&(this[1]._level)->_vptr_ImageLevel)[this->_pixelsPerRow * y + x];
              Imf_2_5::ImageChannel::boundsCheck(this_00,iVar8,iVar9);
              if (0 < (int)uVar1) {
                uVar7 = 0;
                do {
                  if ((half::_toFloat[*(ushort *)((long)pp_Var3 + uVar7 * 2)].f !=
                       half::_toFloat
                       [*(ushort *)
                         ((long)(&(this_00[1]._level)->_vptr_ImageLevel)
                                [this_00->_pixelsPerRow * iVar9 + iVar8] + uVar7 * 2)].f) ||
                     (NAN(half::_toFloat[*(ushort *)((long)pp_Var3 + uVar7 * 2)].f) ||
                      NAN(half::_toFloat
                          [*(ushort *)
                            ((long)(&(this_00[1]._level)->_vptr_ImageLevel)
                                   [this_00->_pixelsPerRow * iVar9 + iVar8] + uVar7 * 2)].f))) {
                    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
                    text = "different sample values";
                    goto LAB_0011c874;
                  }
                  uVar7 = uVar7 + 1;
                } while (uVar1 != uVar7);
              }
              iVar8 = (pIVar2->_dataWindow).max.x;
              bVar4 = x < iVar8;
              x = x + 1;
            } while (bVar4);
            iVar9 = (pIVar2->_dataWindow).max.y;
          }
          bVar4 = y < iVar9;
          y = y + 1;
        } while (bVar4);
      }
      return;
    }
  }
  __cxa_bad_cast();
}

Assistant:

void
verifyPixelsAreEqual
    (const DeepImageChannel &c1,
     const DeepImageChannel &c2,
     int dx,
     int dy)
{
    const TypedDeepImageChannel<T> &tc1 =
        dynamic_cast <const TypedDeepImageChannel<T>&> (c1);

    const TypedDeepImageChannel<T> &tc2 =
        dynamic_cast <const TypedDeepImageChannel<T>&> (c2);

    const Box2i &dataWindow = c1.level().dataWindow();
    const SampleCountChannel &scc1 = c1.deepLevel().sampleCounts();
    const SampleCountChannel &scc2 = c2.deepLevel().sampleCounts();

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; ++y)
    {
        for (int x = dataWindow.min.x; x <= dataWindow.max.x; ++x)
        {
            int n1 = scc1.at (x, y);
            int n2 = scc2.at (x + dx, y + dy);

            if (n1 != n2)
                throw ArgExc ("different pixel sample counts");

            const T* s1 = tc1.at (x, y);
            const T* s2 = tc2.at (x + dx, y + dy);

            for (int i = 0; i < n1; ++i)
                if (s1[i] != s2[i])
                    throw ArgExc ("different sample values");
        }
    }
}